

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
CopyNodes(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
          *this,Node *nodes,hash_t numnodes)

{
  int iVar1;
  Node *pNVar2;
  undefined4 extraout_var;
  FOptionalMapinfoDataPtr *pFVar3;
  FName local_2c;
  
  if (numnodes != 0) {
    pFVar3 = &(nodes->Pair).Value;
    do {
      if (*(long *)(pFVar3 + -2) != 1) {
        local_2c.Index = (((IPair *)(pFVar3 + -1))->Key).Index;
        pNVar2 = NewKey(this,&local_2c);
        iVar1 = (*pFVar3->Ptr->_vptr_FOptionalMapinfoData[2])();
        (pNVar2->Pair).Value.Ptr = (FOptionalMapinfoData *)CONCAT44(extraout_var,iVar1);
      }
      numnodes = numnodes - 1;
      pFVar3 = pFVar3 + 3;
    } while (numnodes != 0);
  }
  return;
}

Assistant:

void CopyNodes(const Node *nodes, hash_t numnodes)
	{
		for (; numnodes-- > 0; ++nodes)
		{
			if (!nodes->IsNil())
			{
				Node *n = NewKey(nodes->Pair.Key);
				::new(&n->Pair.Value) VT(nodes->Pair.Value);
			}
		}
	}